

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_features_state(lys_module *module,char *feature)

{
  int iVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  char *feature_local;
  lys_module *module_local;
  
  if ((module != (lys_module *)0x0) && (feature != (char *)0x0)) {
    for (local_24 = 0; local_24 < (int)(uint)module->features_size; local_24 = local_24 + 1) {
      iVar1 = strcmp(feature,module->features[local_24].name);
      if (iVar1 == 0) {
        if ((module->features[local_24].flags & 0x100) == 0) {
          return 0;
        }
        return 1;
      }
    }
    for (local_28 = 0; local_28 < (int)(uint)module->inc_size; local_28 = local_28 + 1) {
      for (local_24 = 0; local_24 < (int)(uint)(module->inc[local_28].submodule)->features_size;
          local_24 = local_24 + 1) {
        iVar1 = strcmp(feature,(module->inc[local_28].submodule)->features[local_24].name);
        if (iVar1 == 0) {
          if (((module->inc[local_28].submodule)->features[local_24].flags & 0x100) == 0) {
            return 0;
          }
          return 1;
        }
      }
    }
  }
  return -1;
}

Assistant:

API int
lys_features_state(const struct lys_module *module, const char *feature)
{
    int i, j;

    if (!module || !feature) {
        return -1;
    }

    /* search for the specified feature */
    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        if (!strcmp(feature, module->features[i].name)) {
            if (module->features[i].flags & LYS_FENABLED) {
                return 1;
            } else {
                return 0;
            }
        }
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            if (!strcmp(feature, module->inc[j].submodule->features[i].name)) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    return 1;
                } else {
                    return 0;
                }
            }
        }
    }

    /* feature definition not found */
    return -1;
}